

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

_Bool ggml_validate_row_data(ggml_type type,void *data,size_t nbytes)

{
  FILE *__stream;
  _Bool _Var1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ushort uVar7;
  ggml_fp16_t *pgVar8;
  ushort *puVar9;
  size_t i;
  ulong uVar10;
  _Bool _Var11;
  
  if (type < GGML_TYPE_COUNT) {
    sVar3 = ggml_type_size(type);
    __stream = _stderr;
    if (nbytes % sVar3 != 0) {
      pcVar5 = ggml_type_name(type);
      sVar3 = ggml_type_size(type);
      fprintf(__stream,"%s: invalid size %zu for type %s (type size = %zu)\n",
              "ggml_validate_row_data",nbytes,pcVar5,sVar3);
      return false;
    }
    sVar3 = ggml_type_size(type);
    uVar4 = nbytes / sVar3;
    _Var11 = true;
    switch(type) {
    case GGML_TYPE_F32:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_float(*(float *)((long)data + uVar10 * 4),uVar10);
        uVar10 = uVar10 + 1;
      } while (_Var1);
      break;
    case GGML_TYPE_F16:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*(ggml_fp16_t *)((long)data + uVar10 * 2),uVar10);
        uVar10 = uVar10 + 1;
      } while (_Var1);
      break;
    case GGML_TYPE_Q4_0:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x12);
      } while (_Var1);
      break;
    case GGML_TYPE_Q4_1:
      pgVar8 = (ggml_fp16_t *)((long)data + 2);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(pgVar8[-1],uVar10);
        if (!_Var1) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 10;
      } while (_Var1);
      break;
    default:
      goto switchD_0013cf4f_caseD_4;
    case GGML_TYPE_Q5_0:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x16);
      } while (_Var1);
      break;
    case GGML_TYPE_Q5_1:
      pgVar8 = (ggml_fp16_t *)((long)data + 2);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(pgVar8[-1],uVar10);
        if (!_Var1) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0xc;
      } while (_Var1);
      break;
    case GGML_TYPE_Q8_0:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x22);
      } while (_Var1);
      break;
    case GGML_TYPE_Q2_K:
      pgVar8 = (ggml_fp16_t *)((long)data + 0x52);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(pgVar8[-1],uVar10);
        if (!_Var1) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x2a;
      } while (_Var1);
      break;
    case GGML_TYPE_Q3_K:
      pgVar8 = (ggml_fp16_t *)((long)data + 0x6c);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x37;
      } while (_Var1);
      break;
    case GGML_TYPE_Q4_K:
      pgVar8 = (ggml_fp16_t *)((long)data + 2);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(pgVar8[-1],uVar10);
        if (!_Var1) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x48;
      } while (_Var1);
      break;
    case GGML_TYPE_Q5_K:
      pgVar8 = (ggml_fp16_t *)((long)data + 2);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(pgVar8[-1],uVar10);
        if (!_Var1) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x58;
      } while (_Var1);
      break;
    case GGML_TYPE_Q6_K:
      pgVar8 = (ggml_fp16_t *)((long)data + 0xd0);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x69;
      } while (_Var1);
      break;
    case GGML_TYPE_Q8_K:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_float(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x124);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ2_XXS:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x42);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ2_XS:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x4a);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ3_XXS:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x62);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ1_S:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x32);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ4_NL:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x12);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ3_S:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x6e);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ2_S:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x52);
      } while (_Var1);
      break;
    case GGML_TYPE_IQ4_XS:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*data,uVar10);
        uVar10 = uVar10 + 1;
        data = (void *)((long)data + 0x88);
      } while (_Var1);
      break;
    case GGML_TYPE_I8:
    case GGML_TYPE_I16:
    case GGML_TYPE_I32:
    case GGML_TYPE_I64:
      break;
    case GGML_TYPE_F64:
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_float((float)*(double *)((long)data + uVar10 * 8),uVar10);
        uVar10 = uVar10 + 1;
      } while (_Var1);
      break;
    case GGML_TYPE_IQ1_M:
      puVar9 = (ushort *)((long)data + 0x36);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*puVar9 & 0xf000 |
                              puVar9[-1] >> 4 & 0xf00 |
                              *(byte *)((long)puVar9 + -3) & 0xfff0 | puVar9[-3] >> 0xc,uVar10);
        uVar10 = uVar10 + 1;
        puVar9 = puVar9 + 0x1c;
      } while (_Var1);
      break;
    case GGML_TYPE_BF16:
      uVar10 = 0;
      uVar2 = 0;
      for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
        uVar7 = *(ushort *)((long)data + uVar6 * 2) & 0x7fff;
        uVar2 = (uVar2 + 1) - (uint)(uVar7 < 0x7f81);
        uVar10 = (ulong)((int)uVar10 + (uint)(uVar7 == 0x7f80));
      }
      if (uVar2 == 0) {
        if ((int)uVar10 == 0) {
          return true;
        }
        pcVar5 = "%s: found %d infinities in row of %zu BF16 values\n";
      }
      else {
        pcVar5 = "%s: found %d NaNs in row of %zu BF16 values\n";
        uVar10 = (ulong)uVar2;
      }
      _Var11 = false;
      fprintf(_stderr,pcVar5,"ggml_validate_row_data",uVar10,uVar4);
      break;
    case GGML_TYPE_TQ1_0:
      pgVar8 = (ggml_fp16_t *)((long)data + 0x34);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x1b;
      } while (_Var1);
      break;
    case GGML_TYPE_TQ2_0:
      pgVar8 = (ggml_fp16_t *)((long)data + 0x40);
      uVar10 = 0;
      do {
        _Var11 = uVar4 <= uVar10;
        if (_Var11) {
          return _Var11;
        }
        _Var1 = validate_fp16(*pgVar8,uVar10);
        uVar10 = uVar10 + 1;
        pgVar8 = pgVar8 + 0x21;
      } while (_Var1);
    }
  }
  else {
switchD_0013cf4f_caseD_4:
    _Var11 = false;
    fprintf(_stderr,"%s: invalid type %d\n","ggml_validate_row_data",(ulong)type);
  }
  return _Var11;
}

Assistant:

bool ggml_validate_row_data(enum ggml_type type, const void * data, size_t nbytes) {
    if (type < 0 || type >= GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid type %d\n", __func__, type);
        return false;
    }

    if (nbytes % ggml_type_size(type) != 0) {
        fprintf(stderr, "%s: invalid size %zu for type %s (type size = %zu)\n", __func__, nbytes, ggml_type_name(type), ggml_type_size(type));
        return false;
    }

    const size_t nb = nbytes/ggml_type_size(type);

    switch (type) {
        case GGML_TYPE_BF16:
            {
                int nans = 0;
                int infs = 0;
                const unsigned short * f = (const unsigned short *) data;
                for (size_t i = 0; i < nb; ++i) {
                    nans += (f[i] & 0x7fff) > 0x7f80;
                    infs += (f[i] & 0x7fff) == 0x7f80;
                }
                if (nans) {
                    fprintf(stderr, "%s: found %d NaNs in row of %zu BF16 values\n", __func__, nans, nb);
                    return false;
                }
                if (infs) {
                    fprintf(stderr, "%s: found %d infinities in row of %zu BF16 values\n", __func__, infs, nb);
                    return false;
                }
            } break;
        case GGML_TYPE_F16:
            {
                const ggml_fp16_t * f = (const ggml_fp16_t *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 15 < nb; i += 16) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi16(0x7c00));
                    __m256i cmp = _mm256_cmpeq_epi16(vexp, _mm256_set1_epi16(0x7c00));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 16; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 7 < nb; i += 8) {
                    uint16x8_t v = vld1q_u16(f + i);
                    uint16x8_t vexp = vandq_u16(v, vdupq_n_u16(0x7c00));
                    uint16x8_t cmp = vceqq_u16(vexp, vdupq_n_u16(0x7c00));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u8(vshrn_n_u16(cmp, 4)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_fp16(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F32:
            {
                const float * f = (const float *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 7 < nb; i += 8) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi32(0x7f800000));
                    __m256i cmp = _mm256_cmpeq_epi32(vexp, _mm256_set1_epi32(0x7f800000));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 3 < nb; i += 4) {
                    uint32x4_t v = vld1q_u32((const uint32_t *)f + i);
                    uint32x4_t vexp = vandq_u32(v, vdupq_n_u32(0x7f800000));
                    uint32x4_t cmp = vceqq_u32(vexp, vdupq_n_u32(0x7f800000));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u16(vshrn_n_u32(cmp, 8)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 4; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F64:
            {
                const double * f = (const double *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_Q4_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q4_0, data, nb);
            } break;
        case GGML_TYPE_Q4_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q5_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q5_0, data, nb);
            } break;
        case GGML_TYPE_Q5_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q8_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q8_0, data, nb);
            } break;
        case GGML_TYPE_Q2_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q2_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q3_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q3_K, data, nb);
            } break;
        case GGML_TYPE_Q4_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q5_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q6_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q6_K, data, nb);
            } break;
        case GGML_TYPE_Q8_K:
            {
                const block_q8_K * q = (const block_q8_K *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(q[i].d, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_TQ1_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq1_0, data, nb);
            } break;
        case GGML_TYPE_TQ2_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq2_0, data, nb);
            } break;
        case GGML_TYPE_IQ1_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq1_s, data, nb);
            } break;
        case GGML_TYPE_IQ1_M:
            {
                const block_iq1_m * q = (const block_iq1_m *) data;
                for (size_t i = 0; i < nb; ++i) {
                    iq1m_scale_t scale;
                    const uint16_t * sc = (const uint16_t *)q[i].scales;
                    scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
                    if (!validate_fp16(scale.f16, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_IQ2_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xxs, data, nb);
            } break;
        case GGML_TYPE_IQ2_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xs, data, nb);
            } break;
        case GGML_TYPE_IQ2_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_s, data, nb);
            } break;
        case GGML_TYPE_IQ3_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_xxs, data, nb);
            } break;

        case GGML_TYPE_IQ3_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_s, data, nb);
            } break;
        case GGML_TYPE_IQ4_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_xs, data, nb);
            } break;
        case GGML_TYPE_IQ4_NL:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_nl, data, nb);
            } break;

        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_I64:
            // nothing to validate
            break;
        default:
            {
                fprintf(stderr, "%s: invalid type %d\n", __func__, type);
                return false;
            }
    }

    return true;
}